

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoTuples.h
# Opt level: O2

void __thiscall
chrono::ChConstraintTwoTuples<chrono::fea::ChNodeFEAxyz,_chrono::fea::ChTriangleOfXYZROTnodes>::
ChConstraintTwoTuples
          (ChConstraintTwoTuples<chrono::fea::ChNodeFEAxyz,_chrono::fea::ChTriangleOfXYZROTnodes>
           *this,ChConstraintTwoTuples<chrono::fea::ChNodeFEAxyz,_chrono::fea::ChTriangleOfXYZROTnodes>
                 *other)

{
  (this->super_ChConstraint).valid = false;
  (this->super_ChConstraint).disabled = false;
  (this->super_ChConstraint).redundant = false;
  (this->super_ChConstraint).broken = false;
  (this->super_ChConstraint).c_i = 0.0;
  (this->super_ChConstraint).l_i = 0.0;
  (this->super_ChConstraint).b_i = 0.0;
  (this->super_ChConstraint).cfm_i = 0.0;
  (this->super_ChConstraint).active = true;
  (this->super_ChConstraint).mode = CONSTRAINT_LOCK;
  (this->super_ChConstraint).g_i = 0.0;
  (this->super_ChConstraint)._vptr_ChConstraint = (_func_int **)&PTR__ChConstraintTwoTuples_01175080
  ;
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_>::ChConstraintTuple_1vars
            (&this->tuple_a,&other->tuple_a);
  ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>::ChConstraintTuple_3vars
            (&this->tuple_b,&other->tuple_b);
  return;
}

Assistant:

ChConstraintTwoTuples(const ChConstraintTwoTuples& other) : tuple_a(other.tuple_a), tuple_b(other.tuple_b) {}